

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall
RpiControlCore::process_package
          (string *__return_storage_ptr__,RpiControlCore *this,string *header,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  DeviceProperties *this_00;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *pcVar11;
  undefined8 uVar12;
  uint uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string __str;
  string local_2f0;
  string local_2d0;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = sw_str((header->_M_dataplus)._M_p,0);
  if ((int)uVar4 < -0x2f8578c8) {
    if ((int)uVar4 < -0x4f91404f) {
      if (uVar4 == 0x9671e158) {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"get-file","");
        init_response(&local_2f0,&local_1f0);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        get_file(&local_2f0,message);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
      }
      else {
        if (uVar4 == 0x9cf09c18) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"shutdown-device","")
          ;
          init_response(&local_2d0,&local_1b0);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          psVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_2f0.field_2._M_allocated_capacity = *psVar9;
            local_2f0.field_2._8_8_ = puVar8[3];
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          }
          else {
            local_2f0.field_2._M_allocated_capacity = *psVar9;
            local_2f0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_2f0._M_string_length = puVar8[1];
          *puVar8 = psVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
          pcVar11 = extraout_RDX_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
            pcVar11 = extraout_RDX_04;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
            pcVar11 = extraout_RDX_05;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
            pcVar11 = extraout_RDX_06;
          }
          Utils::exec_abi_cxx11_(&local_70,(Utils *)"sudo shutdown",pcVar11);
          local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
          local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_00108016;
        }
        if (uVar4 != 0xac267199) {
          return __return_storage_ptr__;
        }
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"exec-cmd","");
        init_response(&local_2f0,&local_230);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        run_cmd(&local_2f0,message);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
      }
    }
    else {
      if (uVar4 == 0xb06ebfb1) {
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"set-device-name","");
        init_response(&local_2d0,&local_190);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
        psVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2f0.field_2._M_allocated_capacity = *psVar9;
          local_2f0.field_2._8_8_ = puVar8[3];
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar9;
          local_2f0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2f0._M_string_length = puVar8[1];
        *puVar8 = psVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
        pcVar11 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          pcVar11 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          pcVar11 = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          pcVar11 = extraout_RDX_02;
        }
        Utils::exec_abi_cxx11_(&local_50,(Utils *)"sudo reboot",pcVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_00108016;
      }
      if (uVar4 == 0xb99b90dc) {
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,"get-eth-connection","");
        init_response(&local_2f0,&local_210);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        get_eth_connection_abi_cxx11_();
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
      }
      else {
        if (uVar4 != 0xd07a872c) {
          return __return_storage_ptr__;
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"set-sound-volume","");
        init_response(&local_2f0,&local_130);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        uVar6 = strtoul((message->_M_dataplus)._M_p,(char **)0x0,0);
        set_sound_volume((unsigned_short)uVar6);
        uVar3 = get_sound_volume();
        uVar4 = (uint)uVar3;
        uVar13 = 1;
        if (((9 < uVar3) && (uVar13 = 2, 99 < uVar3)) && (uVar13 = 3, 999 < uVar4)) {
          uVar13 = 5 - (uVar4 < 10000);
        }
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_2f0,(char)uVar13);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_2f0._M_dataplus._M_p,uVar13,uVar4);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
      }
    }
  }
  else if ((int)uVar4 < 0x52de5103) {
    if (uVar4 == 0xd07a8738) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"get-sound-volume","");
      init_response(&local_2f0,&local_110);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      uVar3 = get_sound_volume();
      uVar4 = (uint)uVar3;
      uVar13 = 1;
      if (((9 < uVar3) && (uVar13 = 2, 99 < uVar3)) && (uVar13 = 3, 999 < uVar4)) {
        uVar13 = 5 - (uVar4 < 10000);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_2f0,(char)uVar13);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2f0._M_dataplus._M_p,uVar13,uVar4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
    }
    else {
      if (uVar4 != 0x3c2a7b98) {
        if (uVar4 != 0x446f1da4) {
          return __return_storage_ptr__;
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"set-new-password","");
        init_response(&local_2f0,&local_170);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        change_password(message);
        goto LAB_00107b8c;
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"set-device-name","");
      init_response(&local_2f0,&local_150);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      set_device_name(&local_2f0,message);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
    }
  }
  else if ((int)uVar4 < 0x791c5b1e) {
    if (uVar4 == 0x52de5103) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"scanner","");
      init_response(&local_2f0,&local_b0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
      paVar1 = &local_2f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)message);
      if (iVar5 != 0) goto LAB_00107b8c;
      this_00 = (DeviceProperties *)operator_new(0xa0);
      DeviceProperties::DeviceProperties(this_00);
      DeviceProperties::get_device_name_abi_cxx11_(&local_90,this_00);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_2a0 = *puVar10;
        lStack_298 = plVar7[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *puVar10;
        local_2b0 = (ulong *)*plVar7;
      }
      local_2a8 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeviceProperties::get_device_model_abi_cxx11_(&local_250,this_00);
      uVar6 = 0xf;
      if (local_2b0 != &local_2a0) {
        uVar6 = local_2a0;
      }
      if (uVar6 < local_250._M_string_length + local_2a8) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          uVar12 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_250._M_string_length + local_2a8) goto LAB_0010827a;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2b0);
      }
      else {
LAB_0010827a:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_250._M_dataplus._M_p);
      }
      local_290 = &local_280;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_280 = *plVar7;
        uStack_278 = puVar8[3];
      }
      else {
        local_280 = *plVar7;
        local_290 = (long *)*puVar8;
      }
      local_288 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)plVar7 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
      paVar14 = &local_2d0.field_2;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_2d0.field_2._M_allocated_capacity = *puVar10;
        local_2d0.field_2._8_8_ = plVar7[3];
        local_2d0._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *puVar10;
        local_2d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeviceProperties::get_os_version_abi_cxx11_(&local_270,this_00);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar14) {
        uVar12 = local_2d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_270._M_string_length + local_2d0._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          uVar12 = local_270.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_270._M_string_length + local_2d0._M_string_length)
        goto LAB_00108397;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_270,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
      }
      else {
LAB_00108397:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2d0,(ulong)local_270._M_dataplus._M_p);
      }
      psVar9 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2f0.field_2._M_allocated_capacity = *psVar9;
        local_2f0.field_2._8_8_ = puVar8[3];
        local_2f0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar9;
        local_2f0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_2f0._M_string_length = puVar8[1];
      *puVar8 = psVar9;
      puVar8[1] = 0;
      *(undefined1 *)psVar9 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar14) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this_00->DEVICE_PWD_FNAME)._M_dataplus._M_p;
      paVar14 = &(this_00->DEVICE_PWD_FNAME).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar14) {
        operator_delete(pcVar2,paVar14->_M_allocated_capacity + 1);
      }
      pcVar2 = (this_00->DEVICE_NAME_FNAME)._M_dataplus._M_p;
      paVar14 = &(this_00->DEVICE_NAME_FNAME).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar14) {
        operator_delete(pcVar2,paVar14->_M_allocated_capacity + 1);
      }
      pcVar2 = (this_00->DIR_PATH)._M_dataplus._M_p;
      paVar14 = &(this_00->DIR_PATH).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar14) {
        operator_delete(pcVar2,paVar14->_M_allocated_capacity + 1);
      }
      pcVar2 = (this_00->OS_V_FNAME)._M_dataplus._M_p;
      paVar14 = &(this_00->OS_V_FNAME).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar14) {
        operator_delete(pcVar2,paVar14->_M_allocated_capacity + 1);
      }
      pcVar2 = (this_00->MODEL_FNAME)._M_dataplus._M_p;
      paVar14 = &(this_00->MODEL_FNAME).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar14) {
        operator_delete(pcVar2,paVar14->_M_allocated_capacity + 1);
      }
      operator_delete(this_00,0xa0);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
      local_50.field_2._M_allocated_capacity = local_2f0.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_2f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_00108016;
    }
    if (uVar4 != 0x6e044f21) {
      return __return_storage_ptr__;
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"get-dir","");
    init_response(&local_2f0,&local_1d0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    get_dir(&local_2f0,message);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
  }
  else {
    if (uVar4 != 0x791c5b1e) {
      if (uVar4 != 0x7c719bad) {
        return __return_storage_ptr__;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"auth","");
      init_response(&local_2f0,&local_d0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      auth_user(message);
LAB_00107b8c:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"device-info","");
    init_response(&local_2f0,&local_f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    get_device_info_abi_cxx11_();
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_2f0._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity = local_2f0.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_2f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == &local_2f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_00108016:
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string RpiControlCore::process_package(std::string &header, std::string &message) {
    std::string response;

    switch (sw_str(header.data())) {
        case sw_str(H_SCANNER):
            response = init_response(H_SCANNER);
            if (message == PKG_MASK) {
                auto d = new DeviceProperties;
                auto answer = d->get_device_name() + "|" + d->get_device_model() + "|" + d->get_os_version();
                delete d;
                response += answer;
            } else {
                response += "ACCESS_DENY";
            }
            break;

        case sw_str(H_AUTH):
            response = init_response(H_AUTH);
            response += (auth_user(message)) ? "true" : "false";
            break;

        case sw_str(H_DEVICE_INFO):
            response = init_response(H_DEVICE_INFO);
            response += get_device_info();
            break;

        case sw_str(H_GET_SOUND_VOLUME):
            response = init_response(H_GET_SOUND_VOLUME);
            response += std::to_string(get_sound_volume());
            break;

        case sw_str(H_SET_SOUND_VOLUME):
            response = init_response(H_SET_SOUND_VOLUME);
            set_sound_volume(static_cast<unsigned short>( std::strtoul(message.c_str(), nullptr, 0)));
            response += std::to_string(get_sound_volume());
            break;

        case sw_str(H_SET_DEVICE_NAME):
            response = init_response(H_SET_DEVICE_NAME);
            response += set_device_name(message);
            break;

        case sw_str(H_SET_NEW_PASSWORD):
            response = init_response(H_SET_NEW_PASSWORD);
            response += (change_password(message)) ? "true" : "false";
            break;

        case sw_str(H_REBOOT_DEVICE):
            response = init_response(H_SET_DEVICE_NAME) + "OK";
            Utils::exec("sudo reboot");
            break;

        case sw_str(H_SHUTDOWN_DEVICE):
            response = init_response(H_SHUTDOWN_DEVICE) + "OK";
            Utils::exec("sudo shutdown");
            break;

        case sw_str(H_GET_DIR):
            response = init_response(H_GET_DIR);
            response += get_dir(message);
            break;

        case sw_str(H_GET_FILE):
            response = init_response(H_GET_FILE);
            response += get_file(message);
            break;

        case sw_str(H_GET_ETH_CONNECTION):
            response = init_response(H_GET_ETH_CONNECTION);
            response += get_eth_connection();
            break;

        case sw_str(H_EXEC_CMD):
            response = init_response(H_EXEC_CMD);
            response += run_cmd(message);
            break;

        default:
            break;
    }
    return response;
}